

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2c0f7::ParseBuildFileDelegate::loadedTarget
          (ParseBuildFileDelegate *this,StringRef name,Target *target)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *this_00;
  char *pcVar4;
  StringRef local_b0;
  string local_a0;
  reference local_80;
  Node **node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *__range2;
  undefined1 auStack_58 [7];
  bool first;
  string local_48;
  Target *local_28;
  Target *target_local;
  ParseBuildFileDelegate *this_local;
  StringRef name_local;
  
  name_local.Data = (char *)name.Length;
  this_local = (ParseBuildFileDelegate *)name.Data;
  if ((this->showOutput & 1U) != 0) {
    local_28 = target;
    target_local = (Target *)this;
    _auStack_58 = llbuild::buildsystem::Target::getName(target);
    llvm::StringRef::str_abi_cxx11_(&local_48,(StringRef *)auStack_58);
    uVar3 = std::__cxx11::string::c_str();
    printf("target(\'%s\')\n",uVar3);
    std::__cxx11::string::~string((string *)&local_48);
    bVar1 = true;
    printf(" -- nodes: [");
    this_00 = llbuild::buildsystem::Target::getNodes(local_28);
    __end2 = std::
             vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>::
             begin(this_00);
    node = (Node **)std::
                    vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                    ::end(this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<llbuild::buildsystem::Node_*const_*,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
                                  *)&node);
      if (!bVar2) break;
      local_80 = __gnu_cxx::
                 __normal_iterator<llbuild::buildsystem::Node_*const_*,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
                 ::operator*(&__end2);
      pcVar4 = ", ";
      if (bVar1) {
        pcVar4 = "";
      }
      local_b0 = llbuild::buildsystem::Node::getName(*local_80);
      llvm::StringRef::str_abi_cxx11_(&local_a0,&local_b0);
      uVar3 = std::__cxx11::string::c_str();
      printf("%s\'%s\'",pcVar4,uVar3);
      std::__cxx11::string::~string((string *)&local_a0);
      bVar1 = false;
      __gnu_cxx::
      __normal_iterator<llbuild::buildsystem::Node_*const_*,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
      ::operator++(&__end2);
    }
    printf("]\n");
  }
  return;
}

Assistant:

void ParseBuildFileDelegate::loadedTarget(StringRef name,
                                          const Target& target) {
  if (showOutput) {
    printf("target('%s')\n", target.getName().str().c_str());

    // Print the nodes in the target.
    bool first = true;
    printf(" -- nodes: [");
    for (const auto& node: target.getNodes()) {
      printf("%s'%s'", first ? "" : ", ", node->getName().str().c_str());
      first = false;
    }
    printf("]\n");
  }
}